

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::ConditionalDirectiveExpressionSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((kind != BinaryConditionalDirectiveExpression) &&
       (kind != NamedConditionalDirectiveExpression)) &&
      (kind != ParenthesizedConditionalDirectiveExpression)) &&
     (kind != UnaryConditionalDirectiveExpression)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ConditionalDirectiveExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BinaryConditionalDirectiveExpression:
        case SyntaxKind::NamedConditionalDirectiveExpression:
        case SyntaxKind::ParenthesizedConditionalDirectiveExpression:
        case SyntaxKind::UnaryConditionalDirectiveExpression:
            return true;
        default:
            return false;
    }
}